

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::InvalidShaderCompilerOperCase::~InvalidShaderCompilerOperCase
          (InvalidShaderCompilerOperCase *this)

{
  InvalidShaderCompilerOperCase *this_local;
  
  ~InvalidShaderCompilerOperCase(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

InvalidShaderCompilerOperCase::~InvalidShaderCompilerOperCase (void)
{
}